

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Caliper.cpp
# Opt level: O3

void __thiscall
cali::Caliper::push_snapshot(Caliper *this,ChannelBody *chB,SnapshotView trigger_info)

{
  int iVar1;
  ThreadData *pTVar2;
  ThreadData *pTVar3;
  GlobalData *pGVar4;
  ThreadData *pTVar5;
  pointer pfVar6;
  Entry *pEVar7;
  SnapshotView __args_1;
  size_t sVar8;
  ChannelBody *pCVar9;
  int iVar10;
  size_t sVar11;
  unsigned_long __n2_1;
  size_t sVar12;
  ulong uVar13;
  unsigned_long __n2;
  ulong uVar14;
  function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)> *f;
  size_t sVar15;
  pointer this_00;
  SnapshotView __args_2;
  SnapshotView local_60;
  pthread_mutex_t *local_50;
  SnapshotBuilder *local_48;
  ChannelBody *local_40;
  Caliper *local_38;
  
  local_60.m_len = trigger_info.m_len;
  local_60.m_data = trigger_info.m_data;
  pTVar2 = this->sT;
  (pTVar2->lock).m_lock = (pTVar2->lock).m_lock + 1;
  (pTVar2->snapshot).m_builder.m_data = (pTVar2->snapshot).m_data;
  (pTVar2->snapshot).m_builder.m_capacity = 0x78;
  (pTVar2->snapshot).m_builder.m_len = 0;
  (pTVar2->snapshot).m_builder.m_skipped = 0;
  pTVar3 = this->sT;
  local_48 = &(pTVar3->snapshot).m_builder;
  local_40 = chB;
  Blackboard::snapshot(&pTVar3->thread_blackboard,local_48);
  pGVar4 = this->sG;
  pTVar5 = this->sT;
  iVar1 = (pGVar4->process_blackboard).ucount.super___atomic_base<int>._M_i;
  if (pTVar5->process_bb_count < iVar1) {
    local_50 = (pthread_mutex_t *)&pGVar4->process_blackboard_lock;
    (pTVar5->process_snapshot).m_builder.m_data = (pTVar5->process_snapshot).m_data;
    (pTVar5->process_snapshot).m_builder.m_capacity = 0x78;
    (pTVar5->process_snapshot).m_builder.m_len = 0;
    (pTVar5->process_snapshot).m_builder.m_skipped = 0;
    iVar10 = pthread_mutex_lock(local_50);
    if (iVar10 != 0) {
      std::__throw_system_error(iVar10);
    }
    Blackboard::snapshot(&pGVar4->process_blackboard,&(pTVar5->process_snapshot).m_builder);
    pTVar5->process_bb_count = iVar1;
    pthread_mutex_unlock(local_50);
  }
  uVar13 = (this->sT->process_snapshot).m_builder.m_len;
  sVar12 = (pTVar3->snapshot).m_builder.m_capacity;
  sVar11 = (pTVar3->snapshot).m_builder.m_len;
  uVar14 = sVar12 - sVar11;
  if (uVar13 <= sVar12 - sVar11) {
    uVar14 = uVar13;
  }
  if (uVar14 != 0) {
    memmove((pTVar3->snapshot).m_builder.m_data + sVar11,
            (this->sT->process_snapshot).m_builder.m_data,uVar14 * 0x18);
    sVar12 = (pTVar3->snapshot).m_builder.m_capacity;
    sVar11 = (pTVar3->snapshot).m_builder.m_len;
  }
  sVar8 = local_60.m_len;
  sVar11 = sVar11 + uVar14;
  (pTVar3->snapshot).m_builder.m_len = sVar11;
  sVar15 = (uVar13 - uVar14) + (pTVar3->snapshot).m_builder.m_skipped;
  (pTVar3->snapshot).m_builder.m_skipped = sVar15;
  uVar13 = sVar12 - sVar11;
  if (local_60.m_len <= sVar12 - sVar11) {
    uVar13 = local_60.m_len;
  }
  if (uVar13 != 0) {
    memmove((pTVar3->snapshot).m_builder.m_data + sVar11,local_60.m_data,uVar13 * 0x18);
    sVar11 = (pTVar3->snapshot).m_builder.m_len;
    sVar15 = (pTVar3->snapshot).m_builder.m_skipped;
  }
  pCVar9 = local_40;
  (pTVar3->snapshot).m_builder.m_len = sVar11 + uVar13;
  (pTVar3->snapshot).m_builder.m_skipped = (sVar8 - uVar13) + sVar15;
  local_38 = this;
  util::callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotBuilder&)>::operator()
            ((callback<void(cali::Caliper*,cali::SnapshotView,cali::SnapshotBuilder&)> *)
             &(local_40->events).snapshot,&local_38,&local_60,local_48);
  this_00 = (pCVar9->events).process_snapshot.mCb.
            super__Vector_base<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pfVar6 = (pCVar9->events).process_snapshot.mCb.
           super__Vector_base<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>,_std::allocator<std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pfVar6) {
    pEVar7 = (pTVar3->snapshot).m_builder.m_data;
    sVar12 = (pTVar3->snapshot).m_builder.m_len;
    do {
      __args_1.m_len = local_60.m_len;
      __args_1.m_data = local_60.m_data;
      __args_2.m_len = sVar12;
      __args_2.m_data = pEVar7;
      std::function<void_(cali::Caliper_*,_cali::SnapshotView,_cali::SnapshotView)>::operator()
                (this_00,this,__args_1,__args_2);
      this_00 = this_00 + 1;
    } while (this_00 != pfVar6);
  }
  (pTVar2->lock).m_lock = (pTVar2->lock).m_lock + -1;
  return;
}

Assistant:

void Caliper::push_snapshot(ChannelBody* chB, SnapshotView trigger_info)
{
    std::lock_guard<::siglock> g(sT->lock);

    sT->snapshot.reset();
    SnapshotBuilder& rec = sT->snapshot.builder();

    sT->thread_blackboard.snapshot(rec);
    sT->update_process_snapshot(sG->process_blackboard, sG->process_blackboard_lock);
    rec.append(sT->process_snapshot.view());

    rec.append(trigger_info);

    chB->events.snapshot(this, trigger_info, rec);
    chB->events.process_snapshot(this, trigger_info, rec.view());
}